

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_mem.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  log_level lVar2;
  Logger *pLVar3;
  element_type *peVar4;
  char *__src;
  char *pcVar5;
  size_t sVar6;
  allocator<char> local_71;
  undefined1 local_70 [8];
  string s;
  undefined1 local_38 [8];
  shared_ptr<Chunk> sp_chunk;
  vector<Chunk_*,_std::allocator<Chunk_*>_> chunks;
  
  pLVar3 = Logger::get_instance();
  Logger::init(pLVar3,(EVP_PKEY_CTX *)0x0);
  pLVar3 = Logger::get_instance();
  bVar1 = Logger::is_inited(pLVar3);
  if ((!bVar1) && (-1 < pr_level)) {
    printf("[%-5s][%s:%d] logger must be inited before user!\n","error","main",0x3e);
  }
  lVar2 = Logger::get_log_level();
  if (1 < (int)lVar2) {
    pLVar3 = Logger::get_instance();
    Logger::write_log(pLVar3,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/memory/tests/test_mem.cpp"
                      ,"main",0x3e,LOG_LEVEL_INFO,"===================before alloc...\n");
    pLVar3 = Logger::get_instance();
    Logger::flush(pLVar3);
  }
  print_total_size();
  print_left_size();
  print_list_size();
  print_list_content();
  std::vector<Chunk_*,_std::allocator<Chunk_*>_>::vector
            ((vector<Chunk_*,_std::allocator<Chunk_*>_> *)
             &sp_chunk.super___shared_ptr<Chunk,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::make_shared<Chunk,int>((int *)local_38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_70,"hello",&local_71);
  std::allocator<char>::~allocator(&local_71);
  peVar4 = std::__shared_ptr_access<Chunk,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Chunk,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_38);
  pcVar5 = peVar4->data;
  __src = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
  strcpy(pcVar5,__src);
  pcVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70)
  ;
  sVar6 = strlen(pcVar5);
  peVar4 = std::__shared_ptr_access<Chunk,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Chunk,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_38);
  peVar4->length = (int)sVar6;
  pLVar3 = Logger::get_instance();
  bVar1 = Logger::is_inited(pLVar3);
  if ((!bVar1) && (-1 < pr_level)) {
    printf("[%-5s][%s:%d] logger must be inited before user!\n","error","main",0x4b);
  }
  lVar2 = Logger::get_log_level();
  if (1 < (int)lVar2) {
    pLVar3 = Logger::get_instance();
    Logger::write_log(pLVar3,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/memory/tests/test_mem.cpp"
                      ,"main",0x4b,LOG_LEVEL_INFO,"===================start to alloc...\n");
    pLVar3 = Logger::get_instance();
    Logger::flush(pLVar3);
  }
  alloc_and_fill((shared_ptr<Chunk> *)local_38,
                 (vector<Chunk_*,_std::allocator<Chunk_*>_> *)
                 &sp_chunk.super___shared_ptr<Chunk,_(__gnu_cxx::_Lock_policy)2>._M_refcount,m4K,
                 1000);
  pLVar3 = Logger::get_instance();
  bVar1 = Logger::is_inited(pLVar3);
  if ((!bVar1) && (-1 < pr_level)) {
    printf("[%-5s][%s:%d] logger must be inited before user!\n","error","main",0x4d);
  }
  lVar2 = Logger::get_log_level();
  if (1 < (int)lVar2) {
    pLVar3 = Logger::get_instance();
    Logger::write_log(pLVar3,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/memory/tests/test_mem.cpp"
                      ,"main",0x4d,LOG_LEVEL_INFO,"alloc 1000 chunks, chunk size: %dkb\n",4);
    pLVar3 = Logger::get_instance();
    Logger::flush(pLVar3);
  }
  alloc_and_fill((shared_ptr<Chunk> *)local_38,
                 (vector<Chunk_*,_std::allocator<Chunk_*>_> *)
                 &sp_chunk.super___shared_ptr<Chunk,_(__gnu_cxx::_Lock_policy)2>._M_refcount,m16K,
                 1000);
  pLVar3 = Logger::get_instance();
  bVar1 = Logger::is_inited(pLVar3);
  if ((!bVar1) && (-1 < pr_level)) {
    printf("[%-5s][%s:%d] logger must be inited before user!\n","error","main",0x4f);
  }
  lVar2 = Logger::get_log_level();
  if (1 < (int)lVar2) {
    pLVar3 = Logger::get_instance();
    Logger::write_log(pLVar3,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/memory/tests/test_mem.cpp"
                      ,"main",0x4f,LOG_LEVEL_INFO,"alloc 1000 chunks, chunk size: %dkb\n",0x10);
    pLVar3 = Logger::get_instance();
    Logger::flush(pLVar3);
  }
  alloc_and_fill((shared_ptr<Chunk> *)local_38,
                 (vector<Chunk_*,_std::allocator<Chunk_*>_> *)
                 &sp_chunk.super___shared_ptr<Chunk,_(__gnu_cxx::_Lock_policy)2>._M_refcount,m64K,
                 500);
  pLVar3 = Logger::get_instance();
  bVar1 = Logger::is_inited(pLVar3);
  if ((!bVar1) && (-1 < pr_level)) {
    printf("[%-5s][%s:%d] logger must be inited before user!\n","error","main",0x51);
  }
  lVar2 = Logger::get_log_level();
  if (1 < (int)lVar2) {
    pLVar3 = Logger::get_instance();
    Logger::write_log(pLVar3,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/memory/tests/test_mem.cpp"
                      ,"main",0x51,LOG_LEVEL_INFO,"alloc 500 chunks, chunk size: %dkb\n",0x40);
    pLVar3 = Logger::get_instance();
    Logger::flush(pLVar3);
  }
  alloc_and_fill((shared_ptr<Chunk> *)local_38,
                 (vector<Chunk_*,_std::allocator<Chunk_*>_> *)
                 &sp_chunk.super___shared_ptr<Chunk,_(__gnu_cxx::_Lock_policy)2>._M_refcount,m256K,
                 0x1e);
  pLVar3 = Logger::get_instance();
  bVar1 = Logger::is_inited(pLVar3);
  if ((!bVar1) && (-1 < pr_level)) {
    printf("[%-5s][%s:%d] logger must be inited before user!\n","error","main",0x53);
  }
  lVar2 = Logger::get_log_level();
  if (1 < (int)lVar2) {
    pLVar3 = Logger::get_instance();
    Logger::write_log(pLVar3,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/memory/tests/test_mem.cpp"
                      ,"main",0x53,LOG_LEVEL_INFO,"alloc 30 chunks, chunk size: %dkb\n",0x100);
    pLVar3 = Logger::get_instance();
    Logger::flush(pLVar3);
  }
  alloc_and_fill((shared_ptr<Chunk> *)local_38,
                 (vector<Chunk_*,_std::allocator<Chunk_*>_> *)
                 &sp_chunk.super___shared_ptr<Chunk,_(__gnu_cxx::_Lock_policy)2>._M_refcount,m1M,
                 0x1e);
  pLVar3 = Logger::get_instance();
  bVar1 = Logger::is_inited(pLVar3);
  if ((!bVar1) && (-1 < pr_level)) {
    printf("[%-5s][%s:%d] logger must be inited before user!\n","error","main",0x55);
  }
  lVar2 = Logger::get_log_level();
  if (1 < (int)lVar2) {
    pLVar3 = Logger::get_instance();
    Logger::write_log(pLVar3,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/memory/tests/test_mem.cpp"
                      ,"main",0x55,LOG_LEVEL_INFO,"alloc 30 chunks, chunk size: %dkb\n",0x400);
    pLVar3 = Logger::get_instance();
    Logger::flush(pLVar3);
  }
  alloc_and_fill((shared_ptr<Chunk> *)local_38,
                 (vector<Chunk_*,_std::allocator<Chunk_*>_> *)
                 &sp_chunk.super___shared_ptr<Chunk,_(__gnu_cxx::_Lock_policy)2>._M_refcount,m4M,
                 0x1e);
  pLVar3 = Logger::get_instance();
  bVar1 = Logger::is_inited(pLVar3);
  if ((!bVar1) && (-1 < pr_level)) {
    printf("[%-5s][%s:%d] logger must be inited before user!\n","error","main",0x57);
  }
  lVar2 = Logger::get_log_level();
  if (1 < (int)lVar2) {
    pLVar3 = Logger::get_instance();
    Logger::write_log(pLVar3,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/memory/tests/test_mem.cpp"
                      ,"main",0x57,LOG_LEVEL_INFO,"alloc 30 chunks, chunk size: %dkb\n",0x1000);
    pLVar3 = Logger::get_instance();
    Logger::flush(pLVar3);
  }
  pLVar3 = Logger::get_instance();
  bVar1 = Logger::is_inited(pLVar3);
  if ((!bVar1) && (-1 < pr_level)) {
    printf("[%-5s][%s:%d] logger must be inited before user!\n","error","main",0x59);
  }
  lVar2 = Logger::get_log_level();
  if (1 < (int)lVar2) {
    pLVar3 = Logger::get_instance();
    Logger::write_log(pLVar3,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/memory/tests/test_mem.cpp"
                      ,"main",0x59,LOG_LEVEL_INFO,"===================after alloc...\n");
    pLVar3 = Logger::get_instance();
    Logger::flush(pLVar3);
  }
  print_total_size();
  print_left_size();
  print_list_size();
  print_list_content();
  pLVar3 = Logger::get_instance();
  bVar1 = Logger::is_inited(pLVar3);
  if ((!bVar1) && (-1 < pr_level)) {
    printf("[%-5s][%s:%d] logger must be inited before user!\n","error","main",0x5f);
  }
  lVar2 = Logger::get_log_level();
  if (1 < (int)lVar2) {
    pLVar3 = Logger::get_instance();
    Logger::write_log(pLVar3,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/memory/tests/test_mem.cpp"
                      ,"main",0x5f,LOG_LEVEL_INFO,"===================start to retrieve...\n");
    pLVar3 = Logger::get_instance();
    Logger::flush(pLVar3);
  }
  retrieve_chunks((vector<Chunk_*,_std::allocator<Chunk_*>_> *)
                  &sp_chunk.super___shared_ptr<Chunk,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  pLVar3 = Logger::get_instance();
  bVar1 = Logger::is_inited(pLVar3);
  if ((!bVar1) && (-1 < pr_level)) {
    printf("[%-5s][%s:%d] logger must be inited before user!\n","error","main",0x62);
  }
  lVar2 = Logger::get_log_level();
  if (1 < (int)lVar2) {
    pLVar3 = Logger::get_instance();
    Logger::write_log(pLVar3,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/memory/tests/test_mem.cpp"
                      ,"main",0x62,LOG_LEVEL_INFO,"===================after retrieve...\n");
    pLVar3 = Logger::get_instance();
    Logger::flush(pLVar3);
  }
  print_total_size();
  print_left_size();
  print_list_size();
  print_list_content();
  std::__cxx11::string::~string((string *)local_70);
  std::shared_ptr<Chunk>::~shared_ptr((shared_ptr<Chunk> *)local_38);
  std::vector<Chunk_*,_std::allocator<Chunk_*>_>::~vector
            ((vector<Chunk_*,_std::allocator<Chunk_*>_> *)
             &sp_chunk.super___shared_ptr<Chunk,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return 0;
}

Assistant:

int main()
{
    Logger::get_instance()->init(NULL);

    LOG_INFO("===================before alloc...\n");
    print_total_size();
    print_left_size();
    print_list_size();
    print_list_content();

    vector<Chunk*> chunks;

    shared_ptr<Chunk> sp_chunk = make_shared<Chunk>(10);
    string s = "hello";
    strcpy(sp_chunk->data, s.c_str());
    sp_chunk->length = strlen(s.c_str());

    LOG_INFO("===================start to alloc...\n");
    alloc_and_fill(sp_chunk, chunks, m4K, 1000);
    LOG_INFO("alloc 1000 chunks, chunk size: %dkb\n", m4K/1024);
    alloc_and_fill(sp_chunk, chunks, m16K, 1000);   
    LOG_INFO("alloc 1000 chunks, chunk size: %dkb\n", m16K/1024);
    alloc_and_fill(sp_chunk, chunks, m64K, 500);
    LOG_INFO("alloc 500 chunks, chunk size: %dkb\n", m64K/1024);
    alloc_and_fill(sp_chunk, chunks, m256K, 30);
    LOG_INFO("alloc 30 chunks, chunk size: %dkb\n", m256K/1024);
    alloc_and_fill(sp_chunk, chunks, m1M, 30);
    LOG_INFO("alloc 30 chunks, chunk size: %dkb\n", m1M/1024);
    alloc_and_fill(sp_chunk, chunks, m4M, 30);
    LOG_INFO("alloc 30 chunks, chunk size: %dkb\n", m4M/1024);

    LOG_INFO("===================after alloc...\n");
    print_total_size();
    print_left_size();
    print_list_size();
    print_list_content();

    LOG_INFO("===================start to retrieve...\n");
    retrieve_chunks(chunks);

    LOG_INFO("===================after retrieve...\n");
    print_total_size();
    print_left_size();
    print_list_size();
    print_list_content();

    return 0;
}